

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect
          (QGraphicsItemPrivate *this,QGraphicsItem *topMostEffectItem)

{
  bool bVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *in_RDX;
  QGraphicsItemPrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEffect *effect;
  QGraphicsItem *effectParent;
  QGraphicsItem *q;
  QRectF effectRectInParentSpace;
  QRectF brectInParentSpace;
  QRectF *this_00;
  QGraphicsItem *item;
  QGraphicsItemPrivate *rect;
  QGraphicsItemPrivate *in_stack_ffffffffffffff78;
  qreal local_80;
  qreal local_78;
  qreal local_70;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  rect = in_RSI;
  pQVar2 = q_func(in_RSI);
  this_00->xp = -NAN;
  this_00->yp = -NAN;
  this_00->w = -NAN;
  this_00->h = -NAN;
  (*in_RSI->q_ptr->_vptr_QGraphicsItem[3])(local_28);
  effectiveBoundingRect(in_stack_ffffffffffffff78,(QRectF *)rect);
  if ((((*(ulong *)&in_RSI->field_0x160 & 0x20000) == 0) &&
      ((*(ulong *)&in_RSI->field_0x160 & 0x100000) == 0)) && (in_RDX != pQVar2)) {
    pQVar2 = in_RSI->parent;
    while (pQVar2 != (QGraphicsItem *)0x0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar2->d_ptr);
      item = (QGraphicsItem *)pQVar3->graphicsEffect;
      if (((in_RSI->scene != (QGraphicsScene *)0x0) && (item != (QGraphicsItem *)0x0)) &&
         (bVar1 = QGraphicsEffect::isEnabled((QGraphicsEffect *)this_00), bVar1)) {
        QGraphicsItem::mapRectToItem(pQVar2,item,(QRectF *)in_RSI);
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->(&pQVar2->d_ptr);
        effectiveBoundingRect(in_stack_ffffffffffffff78,(QRectF *)rect);
        QGraphicsItem::mapRectToItem(pQVar2,item,(QRectF *)in_RSI);
        this_00->xp = (qreal)in_stack_ffffffffffffff78;
        this_00->yp = local_80;
        this_00->w = local_78;
        this_00->h = local_70;
      }
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar2->d_ptr);
      if ((((*(ulong *)&pQVar3->field_0x160 & 0x20000) != 0) ||
          (pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->(&pQVar2->d_ptr), (*(ulong *)&pQVar3->field_0x160 & 0x100000) != 0))
         || (in_RDX == pQVar2)) break;
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&pQVar2->d_ptr);
      pQVar2 = pQVar3->parent;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(QGraphicsItem *topMostEffectItem) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QRectF brect = effectiveBoundingRect(q_ptr->boundingRect());
    if (ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
        || ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
        || topMostEffectItem == q)
        return brect;

    const QGraphicsItem *effectParent = parent;
    while (effectParent) {
        QGraphicsEffect *effect = effectParent->d_ptr->graphicsEffect;
        if (scene && effect && effect->isEnabled()) {
            const QRectF brectInParentSpace = q->mapRectToItem(effectParent, brect);
            const QRectF effectRectInParentSpace = effectParent->d_ptr->effectiveBoundingRect(brectInParentSpace);
            brect = effectParent->mapRectToItem(q, effectRectInParentSpace);
        }
        if (effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
            || effectParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren
            || topMostEffectItem == effectParent) {
            return brect;
        }
        effectParent = effectParent->d_ptr->parent;
    }

    return brect;
#else //QT_CONFIG(graphicseffect)
    Q_UNUSED(topMostEffectItem);
    return q_ptr->boundingRect();
#endif // QT_CONFIG(graphicseffect)

}